

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fossilize.cpp
# Opt level: O2

void __thiscall
Fossilize::StateRecorder::Impl::push_unregister_locked<VkSampler_T*>
          (Impl *this,VkStructureType sType,VkSampler_T *obj)

{
  WorkItem local_28;
  
  local_28.create_info = (void *)0x0;
  local_28.custom_hash = 0;
  local_28.type = sType;
  local_28.handle = (uint64_t)obj;
  std::deque<Fossilize::WorkItem,_std::allocator<Fossilize::WorkItem>_>::
  emplace_back<Fossilize::WorkItem>(&(this->record_queue).c,&local_28);
  std::condition_variable::notify_one();
  return;
}

Assistant:

void StateRecorder::Impl::push_unregister_locked(VkStructureType sType, T obj)
{
	record_queue.push({sType, api_object_cast<uint64_t>(obj), nullptr, 0});
	record_cv.notify_one();
}